

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O1

void __thiscall PEnum::PEnum(PEnum *this,FName *name,DObject *outer)

{
  int iVar1;
  
  iVar1 = name->Index;
  PType::PType((PType *)this);
  (this->super_PNamedType).Outer = outer;
  (this->super_PNamedType).TypeName.Index = iVar1;
  (this->super_PNamedType).super_PCompoundType.super_PType.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_00846d70;
  this->ValueType = (PType *)0x0;
  (this->Values).NumUsed = 0;
  TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_>::SetNodeVector(&this->Values,1);
  return;
}

Assistant:

PEnum::PEnum(FName name, DObject *outer)
: PNamedType(name, outer), ValueType(NULL)
{
}